

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O0

void predict_or_learn<false>(char *param_1,single_learner *base,example *ec)

{
  ostream *poVar1;
  long in_RDX;
  size_t in_RSI;
  example *in_RDI;
  double dVar2;
  
  LEARNER::learner<char,_example>::predict((learner<char,_example> *)ec,in_RDI,in_RSI);
  if (*(float *)(in_RDX + 0x6850) <= 0.0) {
    *(undefined4 *)(in_RDX + 0x6850) = 0xbf800000;
  }
  else {
    *(undefined4 *)(in_RDX + 0x6850) = 0x3f800000;
  }
  if ((*(float *)(in_RDX + 0x6828) != 3.4028235e+38) || (NAN(*(float *)(in_RDX + 0x6828)))) {
    dVar2 = std::fabs((double)(ulong)*(uint *)(in_RDX + 0x6828));
    if ((SUB84(dVar2,0) != 1.0) || (NAN(SUB84(dVar2,0)))) {
      poVar1 = std::operator<<((ostream *)&std::cout,"You are using label ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RDX + 0x6828));
      poVar1 = std::operator<<(poVar1," not -1 or 1 as loss function expects!");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else if ((*(float *)(in_RDX + 0x6828) != *(float *)(in_RDX + 0x6850)) ||
            (NAN(*(float *)(in_RDX + 0x6828)) || NAN(*(float *)(in_RDX + 0x6850)))) {
      *(undefined4 *)(in_RDX + 0x68b0) = *(undefined4 *)(in_RDX + 0x6870);
    }
    else {
      *(undefined4 *)(in_RDX + 0x68b0) = 0;
    }
  }
  return;
}

Assistant:

void predict_or_learn(char&, LEARNER::single_learner& base, example& ec)
{
  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (ec.pred.scalar > 0)
    ec.pred.scalar = 1;
  else
    ec.pred.scalar = -1;

  if (ec.l.simple.label != FLT_MAX)
  {
    if (fabs(ec.l.simple.label) != 1.f)
      cout << "You are using label " << ec.l.simple.label << " not -1 or 1 as loss function expects!" << endl;
    else if (ec.l.simple.label == ec.pred.scalar)
      ec.loss = 0.;
    else
      ec.loss = ec.weight;
  }
}